

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

void __thiscall cmFindCommon::SelectDefaultRootPathMode(cmFindCommon *this)

{
  bool bVar1;
  char *pcVar2;
  allocator local_69;
  undefined1 local_68 [8];
  string rootPathMode;
  allocator local_31;
  undefined1 local_30 [8];
  string findRootPathVar;
  cmFindCommon *this_local;
  
  findRootPathVar.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"CMAKE_FIND_ROOT_PATH_MODE_",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&this->CMakePathName);
  pcVar2 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_68,pcVar2,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68,"NEVER");
  if (bVar1) {
    this->FindRootPathMode = RootPathModeNever;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,"ONLY");
    if (bVar1) {
      this->FindRootPathMode = RootPathModeOnly;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,"BOTH");
      if (bVar1) {
        this->FindRootPathMode = RootPathModeBoth;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultRootPathMode()
{
  // Check the policy variable for this find command type.
  std::string findRootPathVar = "CMAKE_FIND_ROOT_PATH_MODE_";
  findRootPathVar += this->CMakePathName;
  std::string rootPathMode =
    this->Makefile->GetSafeDefinition(findRootPathVar);
  if (rootPathMode == "NEVER") {
    this->FindRootPathMode = RootPathModeNever;
  } else if (rootPathMode == "ONLY") {
    this->FindRootPathMode = RootPathModeOnly;
  } else if (rootPathMode == "BOTH") {
    this->FindRootPathMode = RootPathModeBoth;
  }
}